

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int band(lua_State *L)

{
  UB UVar1;
  UB UVar2;
  StkId pTVar3;
  uint idx;
  ulong uVar4;
  
  UVar1 = barg(L,1);
  pTVar3 = L->top;
  uVar4 = (ulong)((long)pTVar3 - (long)L->base) >> 4;
  if (1 < (int)uVar4) {
    do {
      idx = (uint)uVar4;
      UVar2 = barg(L,idx);
      UVar1 = UVar1 & UVar2;
      uVar4 = (ulong)(idx - 1);
    } while (2 < idx);
    pTVar3 = L->top;
  }
  (pTVar3->value).n = (double)(int)UVar1;
  pTVar3->tt = 3;
  L->top = L->top + 1;
  return 1;
}

Assistant:

static int band(lua_State*L){
int i;UB b=barg(L,1);for(i=lua_gettop(L);i>1;i--)b&=barg(L,i);BRET(b)}